

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementMeta.cpp
# Opt level: O0

void Rml::ElementMetaPool::Shutdown(void)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  Pool<Rml::ElementMeta> *this;
  int num_objects;
  
  this = &ControlledLifetimeResource<Rml::ElementMetaPool>::operator->
                    ((ControlledLifetimeResource<Rml::ElementMetaPool> *)element_meta_pool)->pool;
  uVar3 = Pool<Rml::ElementMeta>::GetNumAllocatedObjects(this);
  if (uVar3 == 0) {
    ControlledLifetimeResource<Rml::ElementMetaPool>::Shutdown
              ((ControlledLifetimeResource<Rml::ElementMetaPool> *)element_meta_pool);
  }
  else {
    Log::Message(LT_ERROR,
                 "Element meta pool not empty on shutdown, %d object(s) leaked. This will likely lead to a crash when element is destroyed. Ensure that no Rml::Element objects are kept alive in user space at the end of Rml::Shutdown."
                 ,(ulong)uVar3);
    bVar2 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementMeta.cpp"
                   ,0x35);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    ControlledLifetimeResource<Rml::ElementMetaPool>::Leak
              ((ControlledLifetimeResource<Rml::ElementMetaPool> *)element_meta_pool);
  }
  return;
}

Assistant:

void ElementMetaPool::Shutdown()
{
	const int num_objects = element_meta_pool->pool.GetNumAllocatedObjects();
	if (num_objects == 0)
	{
		element_meta_pool.Shutdown();
	}
	else
	{
		Log::Message(Log::LT_ERROR,
			"Element meta pool not empty on shutdown, %d object(s) leaked. This will likely lead to a crash when element is destroyed. Ensure that "
			"no Rml::Element objects are kept alive in user space at the end of Rml::Shutdown.",
			num_objects);
		RMLUI_ERROR;
		element_meta_pool.Leak();
	}
}